

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

Status __thiscall
google::protobuf::File::ReadFileToString(File *this,string *name,string *output,bool text_mode)

{
  int iVar1;
  char *__filename;
  string_view message;
  string_view message_00;
  string_view message_01;
  char *local_490;
  basic_string_view<char,_std::char_traits<char>_> local_470;
  basic_string_view<char,_std::char_traits<char>_> local_460;
  int local_44c;
  size_t sStack_448;
  int error;
  size_t n;
  FILE *local_430;
  FILE *file;
  char buffer [1024];
  bool text_mode_local;
  string *output_local;
  string *name_local;
  
  buffer[0x3ff] = text_mode;
  __filename = (char *)std::__cxx11::string::c_str();
  if ((buffer[0x3ff] & 1U) == 0) {
    local_490 = "rb";
  }
  else {
    local_490 = "rt";
  }
  local_430 = fopen(__filename,local_490);
  if (local_430 == (FILE *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&n,"Could not open file");
    message._M_str = (char *)n;
    message._M_len = (size_t)this;
    absl::lts_20250127::NotFoundError(message);
  }
  else {
    while (sStack_448 = fread(&file,1,0x400,local_430), sStack_448 != 0) {
      std::__cxx11::string::append((char *)output,(ulong)&file);
    }
    local_44c = ferror(local_430);
    iVar1 = fclose(local_430);
    if (iVar1 == 0) {
      if (local_44c == 0) {
        absl::lts_20250127::OkStatus();
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_470,"Error parsing file");
        message_01._M_str = (char *)local_470._M_len;
        message_01._M_len = (size_t)this;
        absl::lts_20250127::InternalError(message_01);
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_460,"Failed to close file");
      message_00._M_str = (char *)local_460._M_len;
      message_00._M_len = (size_t)this;
      absl::lts_20250127::InternalError(message_00);
    }
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status File::ReadFileToString(const std::string& name,
                                    std::string* output, bool text_mode) {
  char buffer[1024];
  FILE* file = fopen(name.c_str(), text_mode ? "rt" : "rb");
  if (file == nullptr) return absl::NotFoundError("Could not open file");

  while (true) {
    size_t n = fread(buffer, 1, sizeof(buffer), file);
    if (n <= 0) break;
    output->append(buffer, n);
  }

  int error = ferror(file);
  if (fclose(file) != 0) return absl::InternalError("Failed to close file");
  if (error != 0) return absl::InternalError("Error parsing file");
  return absl::OkStatus();
}